

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O2

void __thiscall helics::Endpoint::setDefaultDestination(Endpoint *this,string_view target)

{
  string_view target_local;
  
  target_local._M_str = target._M_str;
  target_local._M_len = target._M_len;
  if (((this->defDest)._M_string_length == 0) &&
     ((char)this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] < '\x02')) {
    Interface::addDestinationTarget(&this->super_Interface,(string_view)target,UNKNOWN);
  }
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->defDest,&target_local);
  return;
}

Assistant:

void Endpoint::setDefaultDestination(std::string_view target)
{
    if (defDest.empty() && fed->getCurrentMode() < Federate::Modes::EXECUTING) {
        addDestinationTarget(target);
    }
    defDest = target;
}